

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumDescriptorProto::MergeFrom
          (EnumDescriptorProto *this,EnumDescriptorProto *from)

{
  uint uVar1;
  void *pvVar2;
  Rep *pRVar3;
  string *initial_value;
  string *psVar4;
  void **ppvVar5;
  EnumOptions *this_00;
  int iVar6;
  Arena *pAVar7;
  EnumOptions *from_00;
  
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  iVar6 = (from->value_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar6 != 0) {
    pRVar3 = (from->value_).super_RepeatedPtrFieldBase.rep_;
    ppvVar5 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->value_).super_RepeatedPtrFieldBase,iVar6);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
              (&(this->value_).super_RepeatedPtrFieldBase,ppvVar5,pRVar3->elements,iVar6,
               ((this->value_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->value_).super_RepeatedPtrFieldBase.current_size_);
    iVar6 = iVar6 + (this->value_).super_RepeatedPtrFieldBase.current_size_;
    (this->value_).super_RepeatedPtrFieldBase.current_size_ = iVar6;
    pRVar3 = (this->value_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar6) {
      pRVar3->allocated_size = iVar6;
    }
  }
  iVar6 = (from->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar6 != 0) {
    pRVar3 = (from->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    ppvVar5 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->reserved_range_).super_RepeatedPtrFieldBase,iVar6);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::TypeHandler>
              (&(this->reserved_range_).super_RepeatedPtrFieldBase,ppvVar5,pRVar3->elements,iVar6,
               ((this->reserved_range_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
    iVar6 = iVar6 + (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
    (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar6;
    pRVar3 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar6) {
      pRVar3->allocated_size = iVar6;
    }
  }
  iVar6 = (from->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar6 != 0) {
    pRVar3 = (from->reserved_name_).super_RepeatedPtrFieldBase.rep_;
    ppvVar5 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->reserved_name_).super_RepeatedPtrFieldBase,iVar6);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (&(this->reserved_name_).super_RepeatedPtrFieldBase,ppvVar5,pRVar3->elements,iVar6,
               ((this->reserved_name_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_);
    iVar6 = iVar6 + (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
    (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar6;
    pRVar3 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar6) {
      pRVar3->allocated_size = iVar6;
    }
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      initial_value = (from->name_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      pAVar7 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
      }
      psVar4 = (this->name_).ptr_;
      if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->name_,pAVar7,initial_value);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar4);
      }
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      this_00 = this->options_;
      if (this_00 == (EnumOptions *)0x0) {
        pAVar7 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar7 & 1) != 0) {
          pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
        }
        this_00 = Arena::CreateMaybeMessage<google::protobuf::EnumOptions>(pAVar7);
        this->options_ = this_00;
      }
      from_00 = (EnumOptions *)_EnumOptions_default_instance_;
      if (from->options_ != (EnumOptions *)0x0) {
        from_00 = from->options_;
      }
      EnumOptions::MergeFrom(this_00,from_00);
      return;
    }
  }
  return;
}

Assistant:

void EnumDescriptorProto::MergeFrom(const EnumDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  value_.MergeFrom(from.value_);
  reserved_range_.MergeFrom(from.reserved_range_);
  reserved_name_.MergeFrom(from.reserved_name_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::EnumOptions::MergeFrom(from._internal_options());
    }
  }
}